

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O3

ulong __thiscall nuraft::raft_server::get_expected_committed_log_idx(raft_server *this)

{
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  _Hash_node_base *p_Var1;
  element_type *peVar2;
  long lVar3;
  pointer puVar4;
  pointer puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  char cVar7;
  bool bVar8;
  uint uVar9;
  int32 iVar10;
  int iVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  size_t sVar14;
  long *plVar15;
  _func_int **pp_Var16;
  _func_int **pp_Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  _Hash_node_base *p_Var19;
  _Manager_type p_Var20;
  char cVar21;
  size_t prev_quorum_idx;
  _Manager_type p_Var22;
  __hashtable *__this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  double dVar24;
  string tmp_str;
  vector<unsigned_long,_std::allocator<unsigned_long>_> matched_indexes;
  uint64_t leader_index;
  string __str;
  adjust_commit_index_params aci_params;
  undefined1 local_108 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  string local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  element_type *local_a8;
  uint local_a0;
  undefined1 local_98 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  undefined1 local_78 [40];
  undefined8 uStack_50;
  float local_48;
  undefined8 local_40;
  __node_base_ptr p_Stack_38;
  undefined4 extraout_var;
  
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (_Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(local_78 + 0x10);
  local_78._16_8_ = &p_Stack_38;
  local_78._0_8_ = 0;
  local_78._8_8_ = 0;
  local_78._24_8_ = (__pthread_internal_list *)0x1;
  local_78._32_8_ = (__pthread_internal_list *)0x0;
  uStack_50._0_1_ = false;
  uStack_50._1_1_ = false;
  uStack_50._2_2_ = 0;
  uStack_50._4_4_ = 0;
  local_48 = 1.0;
  local_40._0_4_ = blocking;
  local_40._4_4_ = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_e8,0x10);
  dVar24 = ceil(16.0 / (double)local_48);
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(this_00,(long)(dVar24 - 9.223372036854776e+18) & (long)dVar24 >> 0x3f | (long)dVar24);
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)get_current_leader_index(this);
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(unsigned_long *)&local_b0);
  }
  else {
    *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_finish = (unsigned_long)local_b0._M_pi;
    local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  _Var6._M_pi = local_b0._M_pi;
  pmVar12 = std::__detail::
            _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&this->id_);
  *pmVar12 = (mapped_type)_Var6._M_pi;
  p_Var19 = (this->peers_)._M_h._M_before_begin._M_nxt;
  if (p_Var19 != (_Hash_node_base *)0x0) {
    do {
      p_Var1 = p_Var19[2]._M_nxt[0x10]._M_nxt;
      local_108._0_4_ = *(undefined4 *)&(p_Var19[2]._M_nxt)->_M_nxt->_M_nxt;
      pmVar12 = std::__detail::
                _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,(key_type *)local_108);
      *pmVar12 = (mapped_type)p_Var1;
      bVar8 = is_regular_member(this,(ptr<peer> *)(p_Var19 + 2));
      if (bVar8) {
        local_108._0_8_ =
             ((((ptr<peer> *)(p_Var19 + 2))->
              super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->matched_idx_;
        if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_108);
        }
        else {
          *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = local_108._0_8_;
          local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      p_Var19 = p_Var19->_M_nxt;
    } while (p_Var19 != (_Hash_node_base *)0x0);
  }
  uVar9 = get_num_voting_members(this);
  puVar5 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar13 = (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar3 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
              (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
              (puVar4,puVar5);
  }
  iVar10 = get_quorum_for_commit(this);
  context::get_params((context *)local_108);
  cVar21 = *(char *)(local_108._0_8_ + 0x65);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  p_Var22 = (_Manager_type)(long)iVar10;
  p_Var20 = p_Var22;
  if (cVar21 != '\0') {
    sVar14 = get_not_responding_peers(this);
    if (sVar14 < (ulong)((long)(int)uVar9 - (long)p_Var22)) {
      p_Var20 = (_Manager_type)(~sVar14 + (long)(int)uVar9);
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 5 < iVar11)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_108,
                   "full consensus mode: %zu peers are not responding out of %d, adjust quorum %zu -> %zu"
                   ,sVar14,(ulong)uVar9,p_Var22,p_Var20);
        (*peVar2->_vptr_logger[8])
                  (peVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"get_expected_committed_log_idx",0x4a5,local_108);
        if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_);
        }
      }
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 5 < iVar11)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_108,
                   "full consensus mode, but %zu peers are not responding, required quorum size %zu/%d"
                   ,sVar14,p_Var22 + 1,(ulong)uVar9);
        (*peVar2->_vptr_logger[8])
                  (peVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"get_expected_committed_log_idx",0x4a9,local_108);
        if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_);
        }
      }
    }
  }
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 5 < iVar11)) {
    local_108._0_8_ = local_108 + 0x10;
    local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_108[0x10] = '\0';
    local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_98._16_8_ = p_Var20;
    if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pp_Var16 = p_Var23->_vptr__Sp_counted_base;
        cVar21 = '\x01';
        if ((_func_int **)0x9 < pp_Var16) {
          pp_Var17 = pp_Var16;
          cVar7 = '\x04';
          do {
            cVar21 = cVar7;
            if (pp_Var17 < (_func_int **)0x64) {
              cVar21 = cVar21 + -2;
              goto LAB_0013046f;
            }
            if (pp_Var17 < (_func_int **)0x3e8) {
              cVar21 = cVar21 + -1;
              goto LAB_0013046f;
            }
            if (pp_Var17 < (_func_int **)0x2710) goto LAB_0013046f;
            bVar8 = (_func_int **)0x1869f < pp_Var17;
            pp_Var17 = (_func_int **)((ulong)pp_Var17 / 10000);
            cVar7 = cVar21 + '\x04';
          } while (bVar8);
          cVar21 = cVar21 + '\x01';
        }
LAB_0013046f:
        local_a8 = (element_type *)local_98;
        std::__cxx11::string::_M_construct((ulong)&local_a8,cVar21);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_a8,local_a0,(unsigned_long)pp_Var16);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_a8);
        p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar15 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar15 == p_Var18) {
          local_d0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_d0.field_2._8_8_ = plVar15[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_d0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_d0._M_string_length = plVar15[1];
        *plVar15 = (long)p_Var18;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append(local_108,(ulong)local_d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (local_a8 != (element_type *)local_98) {
          operator_delete(local_a8);
        }
        p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var23->_M_use_count;
      } while (p_Var23 != local_80);
    }
    p_Var20 = (_Manager_type)local_98._16_8_;
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 5 < iVar11)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_d0,"quorum idx %zu, %s",p_Var20,local_108._0_8_);
      (*peVar2->_vptr_logger[8])
                (peVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"get_expected_committed_log_idx",0x4b2,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
  }
  local_78._0_8_ = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
  local_78._8_8_ =
       ((_func_int ***)
       local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start)[(long)p_Var20];
  iVar11 = (*((this->state_machine_).
              super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_state_machine[0x15])();
  pp_Var16 = (_func_int **)CONCAT44(extraout_var,iVar11);
  if ((((_func_int **)local_78._8_8_ != pp_Var16) &&
      (peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      peVar2 != (element_type *)0x0)) && (iVar11 = (*peVar2->_vptr_logger[7])(), 5 < iVar11)) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)local_108,"commit index adjusted: %lu -> %lu",local_78._8_8_,pp_Var16);
    (*peVar2->_vptr_logger[8])
              (peVar2,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"get_expected_committed_log_idx",0x4ba,local_108);
    if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
  }
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(this_00);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (ulong)pp_Var16;
}

Assistant:

ulong raft_server::get_expected_committed_log_idx() {
    std::vector<ulong> matched_indexes;
    state_machine::adjust_commit_index_params aci_params;
    matched_indexes.reserve(16);
    aci_params.peer_index_map_.reserve(16);

    // Put the index of leader itself.
    uint64_t leader_index = get_current_leader_index();
    matched_indexes.push_back( leader_index );
    aci_params.peer_index_map_[id_] = leader_index;

    for (auto& entry: peers_) {
        ptr<peer>& p = entry.second;
        aci_params.peer_index_map_[p->get_id()] = p->get_matched_idx();

        if (!is_regular_member(p)) continue;
        matched_indexes.push_back( p->get_matched_idx() );
    }
    int voting_members = get_num_voting_members();
    assert((int32)matched_indexes.size() == voting_members);

    // NOTE: Descending order.
    //       e.g.) 100 100 99 95 92
    //             => commit on 99 if `quorum_idx == 2`.
    std::sort( matched_indexes.begin(),
               matched_indexes.end(),
               std::greater<ulong>() );

    size_t quorum_idx = get_quorum_for_commit();
    if (ctx_->get_params()->use_full_consensus_among_healthy_members_) {
        size_t not_responding_peers = get_not_responding_peers();
        if (not_responding_peers < voting_members - quorum_idx) {
            // If full consensus option is on, commit should be
            // agreed by all healthy members, and the number of
            // aggreed members should be bigger than regular quorum size.
            size_t prev_quorum_idx = quorum_idx;
            quorum_idx = voting_members - not_responding_peers - 1;
            p_tr( "full consensus mode: %zu peers are not responding out of %d, "
                  "adjust quorum %zu -> %zu",
                  not_responding_peers, voting_members,
                  prev_quorum_idx, quorum_idx );
        } else {
            p_tr( "full consensus mode, but %zu peers are not responding, "
                  "required quorum size %zu/%d",
                  not_responding_peers, quorum_idx + 1, voting_members );
        }
    }

    if (l_ && l_->get_level() >= 6) {
        std::string tmp_str;
        for (ulong m_idx: matched_indexes) {
            tmp_str += std::to_string(m_idx) + " ";
        }
        p_tr("quorum idx %zu, %s", quorum_idx, tmp_str.c_str());
    }

    aci_params.current_commit_index_ = quick_commit_index_;
    aci_params.expected_commit_index_ = matched_indexes[quorum_idx];
    uint64_t adjusted_commit_index = state_machine_->adjust_commit_index(aci_params);
    if (aci_params.expected_commit_index_ != adjusted_commit_index) {
        p_tr( "commit index adjusted: %" PRIu64 " -> %" PRIu64,
              aci_params.expected_commit_index_, adjusted_commit_index );
    }
    return adjusted_commit_index;
}